

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
FastVector<unsigned_char,_false,_false>::grow_and_add
          (FastVector<unsigned_char,_false,_false> *this,uint newSize,uchar *val)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  
  puVar3 = this->data;
  grow_no_destroy(this,newSize);
  uVar1 = *val;
  uVar2 = this->count;
  this->count = uVar2 + 1;
  this->data[uVar2] = uVar1;
  if (puVar3 != (uchar *)0x0) {
    (*(code *)NULLC::dealloc)(puVar3);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}